

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void Json::decodePrefixedString(bool isPrefixed,char *prefixed,uint *length,char **value)

{
  size_t sVar1;
  long *in_RCX;
  undefined4 *in_RDX;
  char *in_RSI;
  byte in_DIL;
  
  if ((in_DIL & 1) == 0) {
    sVar1 = strlen(in_RSI);
    *in_RDX = (int)sVar1;
    *in_RCX = (long)in_RSI;
  }
  else {
    *in_RDX = *(undefined4 *)in_RSI;
    *in_RCX = (long)(in_RSI + 4);
  }
  return;
}

Assistant:

inline static void decodePrefixedString(
    bool isPrefixed, char const* prefixed,
    unsigned* length, char const** value)
{
  if (!isPrefixed) {
    *length = strlen(prefixed);
    *value = prefixed;
  } else {
    *length = *reinterpret_cast<unsigned const*>(prefixed);
    *value = prefixed + sizeof(unsigned);
  }
}